

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncAwait.h
# Opt level: O3

Try<int> * __thiscall
async_simple::coro::syncAwait<async_simple::coro::Lazy<async_simple::Try<bool>>&>
          (Try<int> *__return_storage_ptr__,coro *this,Lazy<async_simple::Try<bool>_> *lazy)

{
  char cVar1;
  Try<int> *__rhs;
  logic_error *this_00;
  undefined8 extraout_RAX;
  Condition cond;
  Try<async_simple::Try<bool>_> value;
  __semaphore_impl local_3c;
  _Variant_storage<false,_std::monostate,_async_simple::Try<bool>,_std::__exception_ptr::exception_ptr>
  local_38;
  type_conflict local_20;
  
  if (*(long **)(*(long *)this + 0x18) != (long *)0x0) {
    cVar1 = (**(code **)(**(long **)(*(long *)this + 0x18) + 0x18))();
    if (cVar1 != '\0') {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"do not sync await in the same executor with Lazy");
      syncAwait<async_simple::coro::Lazy<async_simple::Try<bool>>&>((coro *)this_00);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_async_simple::Try<bool>,_std::__exception_ptr::exception_ptr>
      ::~_Variant_storage(&local_38);
      _Unwind_Resume(extraout_RAX);
    }
  }
  local_20.cond = (Condition *)&local_3c;
  local_3c._M_counter = 0;
  local_20.value = (Try<async_simple::Try<bool>_> *)&local_38;
  local_38._M_index = '\0';
  detail::LazyBase<async_simple::Try<bool>,_false>::
  start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_async_simple_coro_SyncAwait_h:44:16)>
            ((LazyBase<async_simple::Try<bool>,_false> *)this,&local_20);
  std::__atomic_wait_address_bare<std::__atomic_semaphore::_M_acquire()::_lambda()_1_>
            (&local_3c._M_counter,(anon_class_8_1_8991fb9c)&local_3c);
  __rhs = Try<async_simple::Try<bool>_>::value((Try<async_simple::Try<bool>_> *)&local_38);
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_bool,_std::__exception_ptr::exception_ptr>::_Move_ctor_base
            ((_Move_ctor_base<false,_std::monostate,_bool,_std::__exception_ptr::exception_ptr> *)
             __return_storage_ptr__,
             (_Move_ctor_base<false,_std::monostate,_bool,_std::__exception_ptr::exception_ptr> *)
             __rhs);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_async_simple::Try<bool>,_std::__exception_ptr::exception_ptr>
  ::~_Variant_storage(&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline auto syncAwait(LazyType &&lazy) {
    auto executor = lazy.getExecutor();
    if (executor)
        logicAssert(!executor->currentThreadInExecutor(),
                    "do not sync await in the same executor with Lazy");

    util::Condition cond;
    using ValueType = typename std::decay_t<LazyType>::ValueType;

    Try<ValueType> value;
    std::move(std::forward<LazyType>(lazy))
        .start([&cond, &value](Try<ValueType> result) {
            value = std::move(result);
            cond.release();
        });
    cond.acquire();
    return std::move(value).value();
}